

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::InstancingGroup::init
          (InstancingGroup *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 uVar2;
  Context *pCVar3;
  _func_int **pp_Var4;
  undefined8 *puVar5;
  long *plVar6;
  TestNode *pTVar7;
  TestNode *node;
  long *extraout_RAX;
  ulong *puVar8;
  ulong uVar9;
  long lVar10;
  string desc;
  string name;
  ostringstream s;
  ulong *local_290;
  long local_288;
  ulong local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  undefined8 uStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220 [2];
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  long *local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  undefined8 uStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  TestNode *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar10 = 0;
  local_1b0 = (TestNode *)this;
  do {
    local_250 = &local_240;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"draw_arrays_indirect_grid_","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar1 = *(int *)((long)&DAT_01c7b890 + lVar10);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if (local_250 != &local_240) {
      uVar9 = local_240;
    }
    if (uVar9 < (ulong)(local_208 + local_248)) {
      uVar9 = 0xf;
      if (local_210 != local_200) {
        uVar9 = local_200[0];
      }
      if (uVar9 < (ulong)(local_208 + local_248)) goto LAB_013ee4eb;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_250);
    }
    else {
LAB_013ee4eb:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_210);
    }
    local_290 = &local_280;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_280 = *puVar8;
      lStack_278 = puVar5[3];
    }
    else {
      local_280 = *puVar8;
      local_290 = (ulong *)*puVar5;
    }
    local_288 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_270 = &local_260;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_260 = *puVar8;
      lStack_258 = plVar6[3];
    }
    else {
      local_260 = *puVar8;
      local_270 = (ulong *)*plVar6;
    }
    local_268 = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if (local_270 != &local_260) {
      uVar9 = local_260;
    }
    if (uVar9 < (ulong)(local_228 + local_268)) {
      uVar9 = 0xf;
      if (local_230 != local_220) {
        uVar9 = local_220[0];
      }
      if (uVar9 < (ulong)(local_228 + local_268)) goto LAB_013ee636;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_013ee636:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_230);
    }
    local_1f0 = &local_1e0;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_1e0 = *plVar6;
      uStack_1d8 = puVar5[3];
    }
    else {
      local_1e0 = *plVar6;
      local_1f0 = (long *)*puVar5;
    }
    local_1e8 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"DrawArraysIndirect, Grid size ","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar1 = *(int *)((long)&DAT_01c7b890 + lVar10);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if (local_210 != local_200) {
      uVar9 = local_200[0];
    }
    if (uVar9 < (ulong)(local_228 + local_208)) {
      uVar9 = 0xf;
      if (local_230 != local_220) {
        uVar9 = local_220[0];
      }
      if (uVar9 < (ulong)(local_228 + local_208)) goto LAB_013ee7ee;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_013ee7ee:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_230);
    }
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_240 = *puVar8;
      uStack_238 = puVar5[3];
      local_250 = &local_240;
    }
    else {
      local_240 = *puVar8;
      local_250 = (ulong *)*puVar5;
    }
    local_248 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_290 = &local_280;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_280 = *puVar8;
      lStack_278 = plVar6[3];
    }
    else {
      local_280 = *puVar8;
      local_290 = (ulong *)*plVar6;
    }
    local_288 = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if (local_290 != &local_280) {
      uVar9 = local_280;
    }
    if (uVar9 < (ulong)(local_1c8 + local_288)) {
      uVar9 = 0xf;
      if (local_1d0 != local_1c0) {
        uVar9 = local_1c0[0];
      }
      if (uVar9 < (ulong)(local_1c8 + local_288)) goto LAB_013ee942;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013ee942:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1d0);
    }
    local_270 = &local_260;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_260 = *puVar8;
      lStack_258 = puVar5[3];
    }
    else {
      local_260 = *puVar8;
      local_270 = (ulong *)*puVar5;
    }
    local_268 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    pTVar7 = (TestNode *)operator_new(0x80);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    uVar2 = *(undefined4 *)((long)&DAT_01c7b890 + lVar10);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar7,pCVar3->m_testCtx,(char *)local_1f0,(char *)local_270);
    pTVar7[1]._vptr_TestNode = (_func_int **)pCVar3;
    pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a49d8;
    *(undefined4 *)&pTVar7[1].m_testCtx = uVar2;
    *(undefined1 *)((long)&pTVar7[1].m_testCtx + 4) = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar7);
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
    pTVar7 = local_1b0;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x14);
  lVar10 = 0;
  do {
    local_250 = &local_240;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"draw_elements_indirect_grid_","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar1 = *(int *)((long)&DAT_01c7b890 + lVar10);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if (local_250 != &local_240) {
      uVar9 = local_240;
    }
    if (uVar9 < (ulong)(local_208 + local_248)) {
      uVar9 = 0xf;
      if (local_210 != local_200) {
        uVar9 = local_200[0];
      }
      if (uVar9 < (ulong)(local_208 + local_248)) goto LAB_013eebb9;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_250);
    }
    else {
LAB_013eebb9:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_210);
    }
    local_290 = &local_280;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_280 = *puVar8;
      lStack_278 = puVar5[3];
    }
    else {
      local_280 = *puVar8;
      local_290 = (ulong *)*puVar5;
    }
    local_288 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
    local_270 = &local_260;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_260 = *puVar8;
      lStack_258 = plVar6[3];
    }
    else {
      local_260 = *puVar8;
      local_270 = (ulong *)*plVar6;
    }
    local_268 = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if (local_270 != &local_260) {
      uVar9 = local_260;
    }
    if (uVar9 < (ulong)(local_228 + local_268)) {
      uVar9 = 0xf;
      if (local_230 != local_220) {
        uVar9 = local_220[0];
      }
      if (uVar9 < (ulong)(local_228 + local_268)) goto LAB_013eed04;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_013eed04:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_230);
    }
    local_1f0 = &local_1e0;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_1e0 = *plVar6;
      uStack_1d8 = puVar5[3];
    }
    else {
      local_1e0 = *plVar6;
      local_1f0 = (long *)*puVar5;
    }
    local_1e8 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"DrawElementsIndirect, Grid size ","");
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    iVar1 = *(int *)((long)&DAT_01c7b890 + lVar10);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if (local_210 != local_200) {
      uVar9 = local_200[0];
    }
    if (uVar9 < (ulong)(local_228 + local_208)) {
      uVar9 = 0xf;
      if (local_230 != local_220) {
        uVar9 = local_220[0];
      }
      if (uVar9 < (ulong)(local_228 + local_208)) goto LAB_013eeebc;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_013eeebc:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_230);
    }
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_240 = *puVar8;
      uStack_238 = puVar5[3];
      local_250 = &local_240;
    }
    else {
      local_240 = *puVar8;
      local_250 = (ulong *)*puVar5;
    }
    local_248 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_290 = &local_280;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_280 = *puVar8;
      lStack_278 = plVar6[3];
    }
    else {
      local_280 = *puVar8;
      local_290 = (ulong *)*plVar6;
    }
    local_288 = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::ostream::operator<<(local_1a8,iVar1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar9 = 0xf;
    if (local_290 != &local_280) {
      uVar9 = local_280;
    }
    if (uVar9 < (ulong)(local_1c8 + local_288)) {
      uVar9 = 0xf;
      if (local_1d0 != local_1c0) {
        uVar9 = local_1c0[0];
      }
      if (uVar9 < (ulong)(local_1c8 + local_288)) goto LAB_013ef010;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_290);
    }
    else {
LAB_013ef010:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_1d0);
    }
    local_270 = &local_260;
    puVar8 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar8) {
      local_260 = *puVar8;
      lStack_258 = puVar5[3];
    }
    else {
      local_260 = *puVar8;
      local_270 = (ulong *)*puVar5;
    }
    local_268 = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    node = (TestNode *)operator_new(0x80);
    pp_Var4 = pTVar7[1]._vptr_TestNode;
    uVar2 = *(undefined4 *)((long)&DAT_01c7b890 + lVar10);
    tcu::TestCase::TestCase
              ((TestCase *)node,(TestContext *)*pp_Var4,(char *)local_1f0,(char *)local_270);
    node[1]._vptr_TestNode = pp_Var4;
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021a49d8;
    *(undefined4 *)&node[1].m_testCtx = uVar2;
    *(undefined1 *)((long)&node[1].m_testCtx + 4) = 1;
    tcu::TestNode::addChild(pTVar7,node);
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    plVar6 = &local_1e0;
    if (local_1f0 != plVar6) {
      operator_delete(local_1f0,local_1e0 + 1);
      plVar6 = extraout_RAX;
    }
    lVar10 = lVar10 + 4;
    if (lVar10 == 0x14) {
      return (int)plVar6;
    }
  } while( true );
}

Assistant:

void InstancingGroup::init (void)
{
	const int gridWidths[] =
	{
		2,
		5,
		10,
		32,
		100,
	};

	// drawArrays
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(gridWidths); ++ndx)
	{
		const std::string name = std::string("draw_arrays_indirect_grid_") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);
		const std::string desc = std::string("DrawArraysIndirect, Grid size ") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);

		this->addChild(new InstancedGridRenderTest(m_context, name.c_str(), desc.c_str(), gridWidths[ndx], false));
	}

	// drawElements
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(gridWidths); ++ndx)
	{
		const std::string name = std::string("draw_elements_indirect_grid_") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);
		const std::string desc = std::string("DrawElementsIndirect, Grid size ") + de::toString(gridWidths[ndx]) + "x" + de::toString(gridWidths[ndx]);

		this->addChild(new InstancedGridRenderTest(m_context, name.c_str(), desc.c_str(), gridWidths[ndx], true));
	}
}